

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

void __thiscall slang::ast::DiagnosticVisitor::~DiagnosticVisitor(DiagnosticVisitor *this)

{
  pointer p;
  pointer p_00;
  pointer p_01;
  pointer p_02;
  value_type_pointer p_03;
  value_type_pointer p_04;
  
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>_>_>_>
                 *)&this->timingPathMap);
  p = (this->modportsWithExports).
      super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
      .data_;
  if (p != (pointer)(this->modportsWithExports).
                    super_SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
                    .firstElement) {
    operator_delete(p);
  }
  p_00 = (this->externIfaceProtos).super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.
         data_;
  if (p_00 != (pointer)(this->externIfaceProtos).
                       super_SmallVectorBase<const_slang::ast::MethodPrototypeSymbol_*>.firstElement
     ) {
    operator_delete(p_00);
  }
  p_01 = (this->dpiImports).super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.data_;
  if (p_01 != (pointer)(this->dpiImports).
                       super_SmallVectorBase<const_slang::ast::SubroutineSymbol_*>.firstElement) {
    operator_delete(p_01);
  }
  p_02 = (this->genericClasses).super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.
         data_;
  if (p_02 != (pointer)(this->genericClasses).
                       super_SmallVectorBase<const_slang::ast::GenericClassDefSymbol_*>.firstElement
     ) {
    operator_delete(p_02);
  }
  p_03 = (this->usedIfacePorts).table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
         .arrays.elements_;
  if (p_03 != (value_type_pointer)0x0) {
    operator_delete(p_03,(this->usedIfacePorts).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                         .arrays.groups_size_mask * 0x88 + 0x90);
  }
  p_04 = (this->activeInstanceBodies).table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
         .arrays.elements_;
  if (p_04 != (value_type_pointer)0x0) {
    operator_delete(p_04,(this->activeInstanceBodies).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_slang::ast::InstanceBodySymbol_*>,_slang::hash<const_slang::ast::InstanceBodySymbol_*>,_std::equal_to<const_slang::ast::InstanceBodySymbol_*>,_std::allocator<const_slang::ast::InstanceBodySymbol_*>_>
                         .arrays.groups_size_mask * 0x88 + 0x90);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::ast::InstanceCacheKey,_void>,_std::equal_to<slang::ast::InstanceCacheKey>,_std::allocator<std::pair<const_slang::ast::InstanceCacheKey,_slang::ast::DiagnosticVisitor::InstanceCacheEntry>_>_>
                 *)&this->instanceCache);
  return;
}

Assistant:

DiagnosticVisitor(Compilation& compilation, const size_t& numErrors, uint32_t errorLimit) :
        compilation(compilation), numErrors(numErrors), errorLimit(errorLimit) {}